

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O3

size_t quantize_iq3_s(float *src,void *dst,int64_t nrow,int64_t n_per_row,float *quant_weights)

{
  float *pfVar1;
  byte *pbVar2;
  int iVar3;
  uint32_t uVar4;
  char cVar5;
  short sVar9;
  short sVar10;
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  unkuint9 Var26;
  undefined1 auVar27 [11];
  undefined1 auVar28 [13];
  undefined1 auVar29 [14];
  undefined1 auVar30 [15];
  undefined1 auVar31 [11];
  undefined1 auVar32 [13];
  undefined1 auVar33 [14];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  uint6 uVar38;
  uint6 uVar39;
  uint32_t *grid;
  int *piVar40;
  int i;
  long lVar41;
  uint *puVar42;
  ulong uVar43;
  int i_1;
  int8_t *piVar44;
  float *pfVar45;
  undefined8 *puVar46;
  ushort *puVar47;
  ushort *puVar48;
  int is;
  int iVar49;
  char *pcVar50;
  float *pfVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  short sVar56;
  ushort uVar57;
  short sVar58;
  anon_union_4_2_5fd15f10 fp32;
  float fVar59;
  float fVar60;
  float fVar80;
  undefined1 auVar62 [15];
  ushort uVar77;
  float fVar79;
  float fVar85;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined4 uVar81;
  undefined1 auVar68 [16];
  ushort uVar74;
  ushort uVar75;
  ushort uVar78;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  anon_union_4_2_5fd15f10 fp32_2;
  float fVar86;
  undefined1 auVar87 [15];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  uint8_t block_signs [4];
  _Bool is_on_grid_aux [8];
  int8_t L [32];
  int8_t Laux [32];
  float scales [8];
  float xval [32];
  float weight [32];
  float waux [32];
  uint local_2fc;
  ushort *local_2f8;
  ushort *local_2f0;
  long local_2e8;
  uint16_t *local_2e0;
  float local_2d4;
  float local_2d0;
  float local_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  long local_2a8;
  float *local_2a0;
  ulong local_298;
  void *local_290;
  float *local_288;
  float *local_280;
  uint *local_278;
  undefined8 local_270;
  float *local_268;
  long local_260;
  long local_258;
  int64_t local_250;
  long local_248;
  ulong local_240;
  float *local_238;
  undefined8 local_230;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  float local_1d8 [4];
  float local_1c8 [8];
  uint auStack_1a8 [28];
  float afStack_138 [66];
  char cVar6;
  char cVar7;
  char cVar8;
  undefined6 uVar61;
  undefined1 uVar72;
  undefined1 uVar73;
  undefined1 uVar76;
  
  local_2a0 = src;
  local_290 = dst;
  local_280 = quant_weights;
  if ((char)n_per_row != '\0') {
    pcVar50 = "n_per_row%QK_K == 0";
    iVar49 = 0xf7a;
LAB_00137795:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-quants.c"
               ,iVar49,"GGML_ASSERT(%s) failed",pcVar50);
  }
  local_2a8 = n_per_row >> 8;
  if (0 < nrow) {
    local_298 = (ulong)(uint)((int)n_per_row >> 8);
    local_260 = local_2a8 * 0x6e;
    local_258 = n_per_row << 2;
    lVar41 = 0;
    auVar104 = _DAT_0014e740;
    local_250 = nrow;
    do {
      piVar40 = iq3_data[1].map;
      grid = iq3_data[1].grid;
      if (iq3_data[1].grid == (uint32_t *)0x0) {
        pcVar50 = "kgrid_q3xs && \"forgot to call ggml_quantize_init()?\"";
        iVar49 = 0xed5;
        goto LAB_00137795;
      }
      if (iq3_data[1].map == (int *)0x0) {
        pcVar50 = "kmap_q3xs && \"forgot to call ggml_quantize_init()?\"";
        iVar49 = 0xed6;
        goto LAB_00137795;
      }
      local_2e0 = iq3_data[1].neighbours;
      if (iq3_data[1].neighbours == (uint16_t *)0x0) {
        pcVar50 = "kneighbors_q3xs && \"forgot to call ggml_quantize_init()?\"";
        iVar49 = 0xed7;
        goto LAB_00137795;
      }
      local_248 = lVar41;
      if (0 < (int)local_298) {
        local_2e0 = iq3_data[1].neighbours + -1;
        local_288 = local_280;
        uVar43 = 0;
        pfVar45 = local_2a0;
        do {
          lVar41 = uVar43 * 0x6e;
          puVar47 = (ushort *)((long)local_290 + lVar41);
          puVar46 = (undefined8 *)((long)local_290 + lVar41 + 0x5e);
          *puVar46 = 0;
          puVar46[1] = 0;
          puVar46 = (undefined8 *)((long)local_290 + lVar41 + 0x50);
          *puVar46 = 0;
          puVar46[1] = 0;
          puVar46 = (undefined8 *)((long)local_290 + lVar41 + 0x40);
          *puVar46 = 0;
          puVar46[1] = 0;
          puVar46 = (undefined8 *)((long)local_290 + lVar41 + 0x30);
          *puVar46 = 0;
          puVar46[1] = 0;
          puVar46 = (undefined8 *)((long)local_290 + lVar41 + 0x20);
          *puVar46 = 0;
          puVar46[1] = 0;
          puVar46 = (undefined8 *)((long)local_290 + lVar41 + 0x10);
          *puVar46 = 0;
          puVar46[1] = 0;
          *(undefined8 *)((long)local_290 + lVar41) = 0;
          ((undefined8 *)((long)local_290 + lVar41))[1] = 0;
          auVar99 = ZEXT816(0);
          lVar41 = 0;
          do {
            fVar86 = auVar99._0_4_ + pfVar45[lVar41] * pfVar45[lVar41];
            auVar99._0_4_ = fVar86;
            lVar41 = lVar41 + 1;
          } while (lVar41 != 0x100);
          puVar48 = puVar47 + 1;
          local_278 = (uint *)(puVar47 + 0x25);
          local_2d4 = (fVar86 + fVar86) * 0.00390625;
          fVar86 = 0.0;
          local_268 = local_288;
          lVar41 = 0;
          pfVar51 = pfVar45;
          local_2f8 = puVar47;
          local_240 = uVar43;
          local_238 = pfVar45;
          do {
            local_2e8 = lVar41;
            if (local_280 == (float *)0x0) {
              lVar41 = 0;
              do {
                pfVar1 = pfVar45 + lVar41;
                fVar59 = pfVar1[1];
                fVar80 = pfVar1[2];
                fVar85 = pfVar1[3];
                afStack_138[lVar41] = *pfVar1 * *pfVar1;
                afStack_138[lVar41 + 1] = fVar59 * fVar59;
                afStack_138[lVar41 + 2] = fVar80 * fVar80;
                afStack_138[lVar41 + 3] = fVar85 * fVar85;
                lVar41 = lVar41 + 4;
              } while (lVar41 != 0x20);
            }
            else {
              lVar41 = 0;
              do {
                fVar59 = pfVar45[lVar41] * pfVar45[lVar41] + local_2d4;
                if (fVar59 < 0.0) {
                  local_2b8 = local_268[lVar41];
                  fVar59 = sqrtf(fVar59);
                  auVar104 = _DAT_0014e740;
                  fVar80 = local_2b8;
                }
                else {
                  fVar59 = SQRT(fVar59);
                  fVar80 = local_268[lVar41];
                }
                afStack_138[lVar41] = fVar80 * fVar59;
                lVar41 = lVar41 + 1;
              } while (lVar41 != 0x20);
            }
            lVar41 = 0;
            do {
              fVar59 = afStack_138[lVar41];
              if (fVar59 < 0.0) {
                fVar59 = sqrtf(fVar59);
                auVar104 = _DAT_0014e740;
              }
              else {
                fVar59 = SQRT(fVar59);
              }
              afStack_138[lVar41 + 0x20] = fVar59;
              lVar41 = lVar41 + 1;
            } while (lVar41 != 0x20);
            lVar41 = 0x10;
            puVar42 = &local_2fc;
            do {
              pfVar1 = (float *)((long)pfVar45 + lVar41 + -0x10);
              fVar59 = *pfVar1;
              fVar80 = pfVar1[1];
              fVar85 = pfVar1[2];
              fVar93 = pfVar1[3];
              uVar52 = -(uint)(fVar59 < -fVar59);
              uVar53 = -(uint)(fVar80 < -fVar80);
              uVar54 = -(uint)(fVar85 < -fVar85);
              uVar55 = -(uint)(fVar93 < -fVar93);
              auVar94._0_8_ = CONCAT44(uVar53,uVar52);
              auVar94._8_4_ = uVar54;
              auVar94._12_4_ = uVar55;
              auVar98._8_4_ = uVar54;
              auVar98._0_8_ = auVar94._0_8_;
              auVar98._12_4_ = uVar55;
              auVar99 = packssdw(auVar98,auVar94);
              auVar99 = packsswb(auVar99,auVar99);
              *(uint *)((long)local_1c8 + lVar41) = ~uVar52 & (uint)fVar59 | (uint)-fVar59 & uVar52;
              *(uint *)((long)local_1c8 + lVar41 + 4) =
                   ~uVar53 & (uint)fVar80 | (uint)-fVar80 & uVar53;
              *(uint *)((long)local_1c8 + lVar41 + 8) =
                   ~uVar54 & (uint)fVar85 | (uint)-fVar85 & uVar54;
              *(uint *)((long)local_1c8 + lVar41 + 0xc) =
                   ~uVar55 & (uint)fVar93 | (uint)-fVar93 & uVar55;
              pfVar1 = (float *)((long)pfVar45 + lVar41);
              fVar59 = *pfVar1;
              fVar80 = pfVar1[1];
              fVar85 = pfVar1[2];
              fVar93 = pfVar1[3];
              uVar52 = -(uint)(fVar59 < -fVar59);
              uVar53 = -(uint)(fVar80 < -fVar80);
              uVar54 = -(uint)(fVar85 < -fVar85);
              uVar55 = -(uint)(fVar93 < -fVar93);
              auVar95._0_8_ = CONCAT44(uVar53,uVar52);
              auVar95._8_4_ = uVar54;
              auVar95._12_4_ = uVar55;
              auVar102._8_4_ = uVar54;
              auVar102._0_8_ = auVar95._0_8_;
              auVar102._12_4_ = uVar55;
              auVar103 = packssdw(auVar102,auVar95);
              auVar103 = packsswb(auVar103,auVar103);
              auVar99 = auVar103 & ZEXT416(0x80402010) | auVar99 & ZEXT416(0x8040201);
              *(uint *)((long)local_1c8 + lVar41 + 0x10) =
                   ~uVar52 & (uint)fVar59 | (uint)-fVar59 & uVar52;
              *(uint *)((long)local_1c8 + lVar41 + 0x14) =
                   ~uVar53 & (uint)fVar80 | (uint)-fVar80 & uVar53;
              *(uint *)((long)local_1c8 + lVar41 + 0x18) =
                   ~uVar54 & (uint)fVar85 | (uint)-fVar85 & uVar54;
              *(uint *)((long)local_1c8 + lVar41 + 0x1c) =
                   ~uVar55 & (uint)fVar93 | (uint)-fVar93 & uVar55;
              auVar103._0_4_ = auVar99._0_4_ >> 0x10;
              auVar103._4_4_ = 0;
              auVar103._8_4_ = auVar99._8_4_ >> 0x10;
              auVar103._12_4_ = auVar99._12_4_ >> 0x10;
              *(byte *)puVar42 = SUB161(auVar103 | auVar99,1) | SUB161(auVar103 | auVar99,0);
              lVar41 = lVar41 + 0x20;
              puVar42 = (uint *)((long)puVar42 + 1);
            } while (lVar41 != 0x90);
            lVar41 = 1;
            fVar59 = local_1c8[4];
            do {
              if (fVar59 <= local_1c8[lVar41 + 4]) {
                fVar59 = local_1c8[lVar41 + 4];
              }
              lVar41 = lVar41 + 1;
            } while (lVar41 != 0x20);
            if ((fVar59 != 0.0) || (NAN(fVar59))) {
              _local_2c8 = ZEXT416((uint)(fVar59 / 15.0));
              iVar49 = -9;
              _local_228 = ZEXT812(0);
              fStack_21c = 0.0;
              local_270 = 0;
              auVar99 = _DAT_0014e9c0;
              local_2f0 = puVar48;
              local_2d0 = fVar59;
              do {
                fVar93 = ((float)iVar49 * 0.2 + 15.0) / local_2d0;
                local_2cc = 1.0 / fVar93;
                piVar44 = (int8_t *)&local_1f8;
                puVar46 = &local_230;
                lVar41 = 0;
                fVar59 = fVar93;
                fVar80 = fVar93;
                fVar85 = fVar93;
                local_2b8 = fVar93;
                fStack_2b4 = fVar93;
                fStack_2b0 = fVar93;
                fStack_2ac = fVar93;
                do {
                  fVar60 = (*(float *)((long)local_1c8 + lVar41 + 0x10) * fVar93 + -1.0) * 0.5 +
                           12582912.0;
                  fVar79 = (*(float *)((long)local_1c8 + lVar41 + 0x14) * fVar59 + -1.0) * 0.5 +
                           12582912.0;
                  auVar63._0_8_ = CONCAT44(fVar79,fVar60) & 0x7fffff007fffff;
                  auVar63._8_4_ =
                       (uint)((*(float *)((long)local_1c8 + lVar41 + 0x18) * fVar80 + -1.0) * 0.5 +
                             12582912.0) & 0x7fffff;
                  auVar63._12_4_ =
                       (uint)((*(float *)((long)local_1c8 + lVar41 + 0x1c) * fVar85 + -1.0) * 0.5 +
                             12582912.0) & 0x7fffff;
                  auVar88._0_4_ = -(uint)((int)((uint)fVar60 & 0x7fffff) < auVar99._0_4_);
                  auVar88._4_4_ = -(uint)((int)((uint)fVar79 & 0x7fffff) < auVar99._4_4_);
                  auVar88._8_4_ = -(uint)((int)auVar63._8_4_ < auVar99._8_4_);
                  auVar88._12_4_ = -(uint)((int)auVar63._12_4_ < auVar99._12_4_);
                  auVar103 = ~auVar88 & auVar99 | auVar63 & auVar88;
                  auVar64._0_4_ = -(uint)(0x400000 < auVar103._0_4_);
                  auVar64._4_4_ = -(uint)(0x400000 < auVar103._4_4_);
                  auVar64._8_4_ = -(uint)(0x400000 < auVar103._8_4_);
                  auVar64._12_4_ = -(uint)(0x400000 < auVar103._12_4_);
                  auVar103 = auVar64 & auVar103 & auVar104;
                  sVar9 = auVar103._0_2_;
                  cVar5 = (0 < sVar9) * (sVar9 < 0x100) * auVar103[0] - (0xff < sVar9);
                  sVar9 = auVar103._2_2_;
                  sVar56 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar103[2] - (0xff < sVar9),
                                    cVar5);
                  sVar9 = auVar103._4_2_;
                  cVar6 = (0 < sVar9) * (sVar9 < 0x100) * auVar103[4] - (0xff < sVar9);
                  sVar9 = auVar103._6_2_;
                  uVar81 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar103[6] - (0xff < sVar9),
                                    CONCAT12(cVar6,sVar56));
                  sVar9 = auVar103._8_2_;
                  cVar7 = (0 < sVar9) * (sVar9 < 0x100) * auVar103[8] - (0xff < sVar9);
                  sVar9 = auVar103._10_2_;
                  uVar61 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar103[10] - (0xff < sVar9),
                                    CONCAT14(cVar7,uVar81));
                  sVar9 = auVar103._12_2_;
                  cVar8 = (0 < sVar9) * (sVar9 < 0x100) * auVar103[0xc] - (0xff < sVar9);
                  sVar10 = auVar103._14_2_;
                  cVar5 = (0 < sVar56) * (sVar56 < 0x100) * cVar5 - (0xff < sVar56);
                  sVar9 = (short)((uint)uVar81 >> 0x10);
                  sVar56 = (short)((uint6)uVar61 >> 0x20);
                  sVar10 = (short)(CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar103[0xe] -
                                            (0xff < sVar10),CONCAT16(cVar8,uVar61)) >> 0x30);
                  *(uint *)piVar44 =
                       CONCAT13((0 < sVar10) * (sVar10 < 0x100) * cVar8 - (0xff < sVar10),
                                CONCAT12((0 < sVar56) * (sVar56 < 0x100) * cVar7 - (0xff < sVar56),
                                         CONCAT11((0 < sVar9) * (sVar9 < 0x100) * cVar6 -
                                                  (0xff < sVar9),cVar5)));
                  iVar3 = piVar40[((uint)(byte)piVar44[3] << 9 |
                                   (int)piVar44[2] << 6 | (int)piVar44[1] << 3 | (int)cVar5) &
                                  0xffff];
                  *(undefined1 *)puVar46 = 1;
                  if ((long)iVar3 < 0) {
                    *(undefined1 *)puVar46 = 0;
                    iq3_find_best_neighbour
                              (local_2e0 + -(long)iVar3,grid,
                               (float *)((long)local_1c8 + lVar41 + 0x10),
                               (float *)((long)afStack_138 + lVar41 + 0x80),local_2cc,piVar44);
                    auVar99 = _DAT_0014e9c0;
                    auVar104 = _DAT_0014e740;
                    fVar93 = local_2b8;
                    fVar59 = fStack_2b4;
                    fVar80 = fStack_2b0;
                    fVar85 = fStack_2ac;
                  }
                  puVar48 = local_2f0;
                  puVar47 = local_2f8;
                  lVar41 = lVar41 + 0x10;
                  puVar46 = (undefined8 *)((long)puVar46 + 1);
                  piVar44 = piVar44 + 4;
                } while (lVar41 != 0x80);
                fVar59 = 0.0;
                fVar80 = 0.0;
                fVar85 = 0.0;
                fVar93 = 0.0;
                lVar41 = 0;
                do {
                  fVar79 = (float)(*(char *)((long)&local_1f8 + lVar41) * 2 + 1);
                  fVar60 = afStack_138[lVar41];
                  fVar59 = fVar59 + fVar79 * local_1c8[lVar41 + 4] * fVar60;
                  fVar80 = fVar80 + fVar79 * fVar79 * fVar60;
                  fVar85 = fVar85 + fVar79 * fVar60 * 0.0;
                  fVar93 = fVar93 + fVar79 * fVar60 * 0.0;
                  lVar41 = lVar41 + 1;
                } while (lVar41 != 0x20);
                if ((0.0 < fVar80) && ((float)local_228._0_4_ * fVar80 < fVar59 * fVar59)) {
                  local_208 = local_1e8;
                  local_218 = local_1f8;
                  uStack_210 = uStack_1f0;
                  local_270 = local_230;
                  local_2c8._4_4_ = fVar80;
                  local_2c8._0_4_ = fVar59 / fVar80;
                  fStack_2c0 = fVar85;
                  fStack_2bc = fVar93;
                  local_228._4_4_ = fVar80;
                  local_228._0_4_ = fVar59 * (fVar59 / fVar80);
                  fStack_220 = fVar85;
                  fStack_21c = fVar93;
                }
                iVar49 = iVar49 + 1;
              } while (iVar49 != 10);
              auVar62 = ZEXT415((uint)local_270) ^ DAT_0014e6c0._0_15_;
              auVar87[0xd] = 0;
              auVar87._0_13_ = auVar62._0_13_;
              auVar87[0xe] = auVar62[7];
              auVar14[0xc] = auVar62[6];
              auVar14._0_12_ = auVar62._0_12_;
              auVar14._13_2_ = auVar87._13_2_;
              auVar16[0xb] = 0;
              auVar16._0_11_ = auVar62._0_11_;
              auVar16._12_3_ = auVar14._12_3_;
              auVar18[10] = auVar62[5];
              auVar18._0_10_ = auVar62._0_10_;
              auVar18._11_4_ = auVar16._11_4_;
              auVar20[9] = 0;
              auVar20._0_9_ = auVar62._0_9_;
              auVar20._10_5_ = auVar18._10_5_;
              auVar22[8] = auVar62[4];
              auVar22._0_8_ = auVar62._0_8_;
              auVar22._9_6_ = auVar20._9_6_;
              auVar25._7_8_ = 0;
              auVar25._0_7_ = auVar22._8_7_;
              Var26 = CONCAT81(SUB158(auVar25 << 0x40,7),auVar62[3]);
              auVar34._9_6_ = 0;
              auVar34._0_9_ = Var26;
              auVar27._1_10_ = SUB1510(auVar34 << 0x30,5);
              auVar27[0] = auVar62[2];
              auVar35._11_4_ = 0;
              auVar35._0_11_ = auVar27;
              auVar28._1_12_ = SUB1512(auVar35 << 0x20,3);
              auVar28[0] = auVar62[1];
              uVar57 = CONCAT11(0,auVar62[0]);
              auVar24._2_13_ = auVar28;
              auVar24._0_2_ = uVar57;
              auVar12._10_2_ = 0;
              auVar12._0_10_ = auVar24._0_10_;
              auVar12._12_2_ = (short)Var26;
              uVar38 = CONCAT42(auVar12._10_4_,auVar27._0_2_);
              auVar29._6_8_ = 0;
              auVar29._0_6_ = uVar38;
              auVar87 = ZEXT415((uint)((ulong)local_270 >> 0x20)) ^ DAT_0014e6c0._0_15_;
              auVar62[0xd] = 0;
              auVar62._0_13_ = auVar87._0_13_;
              auVar62[0xe] = auVar87[7];
              auVar13[0xc] = auVar87[6];
              auVar13._0_12_ = auVar87._0_12_;
              auVar13._13_2_ = auVar62._13_2_;
              auVar15[0xb] = 0;
              auVar15._0_11_ = auVar87._0_11_;
              auVar15._12_3_ = auVar13._12_3_;
              auVar17[10] = auVar87[5];
              auVar17._0_10_ = auVar87._0_10_;
              auVar17._11_4_ = auVar15._11_4_;
              auVar19[9] = 0;
              auVar19._0_9_ = auVar87._0_9_;
              auVar19._10_5_ = auVar17._10_5_;
              auVar21[8] = auVar87[4];
              auVar21._0_8_ = auVar87._0_8_;
              auVar21._9_6_ = auVar19._9_6_;
              auVar30._7_8_ = 0;
              auVar30._0_7_ = auVar21._8_7_;
              Var26 = CONCAT81(SUB158(auVar30 << 0x40,7),auVar87[3]);
              auVar36._9_6_ = 0;
              auVar36._0_9_ = Var26;
              auVar31._1_10_ = SUB1510(auVar36 << 0x30,5);
              auVar31[0] = auVar87[2];
              auVar37._11_4_ = 0;
              auVar37._0_11_ = auVar31;
              auVar32._1_12_ = SUB1512(auVar37 << 0x20,3);
              auVar32[0] = auVar87[1];
              uVar74 = CONCAT11(0,auVar87[0]);
              auVar23._2_13_ = auVar32;
              auVar23._0_2_ = uVar74;
              auVar11._10_2_ = 0;
              auVar11._0_10_ = auVar23._0_10_;
              auVar11._12_2_ = (short)Var26;
              uVar39 = CONCAT42(auVar11._10_4_,auVar31._0_2_);
              auVar33._6_8_ = 0;
              auVar33._0_6_ = uVar39;
              auVar103 = _local_2c8;
              if (((auVar11._10_4_ >> 0x10) + (auVar12._10_4_ >> 0x10) +
                   (int)CONCAT82(SUB148(auVar33 << 0x40,6),auVar32._0_2_) +
                   (int)CONCAT82(SUB148(auVar29 << 0x40,6),auVar28._0_2_) +
                   (int)uVar39 + (int)uVar38 + (uint)uVar74 + (uint)uVar57 != 0) &&
                 (0.0 < local_2c8._0_4_)) {
                fVar93 = 1.0 / local_2c8._0_4_;
                piVar44 = (int8_t *)&local_218;
                lVar41 = 0;
                fVar59 = fVar93;
                fVar80 = fVar93;
                fVar85 = fVar93;
                local_2b8 = fVar93;
                fStack_2b4 = fVar93;
                fStack_2b0 = fVar93;
                fStack_2ac = fVar93;
                do {
                  fVar60 = (*(float *)((long)local_1c8 + lVar41 + 0x10) * fVar93 + -1.0) * 0.5 +
                           12582912.0;
                  fVar79 = (*(float *)((long)local_1c8 + lVar41 + 0x14) * fVar59 + -1.0) * 0.5 +
                           12582912.0;
                  auVar65._0_8_ = CONCAT44(fVar79,fVar60) & 0x7fffff007fffff;
                  auVar65._8_4_ =
                       (uint)((*(float *)((long)local_1c8 + lVar41 + 0x18) * fVar80 + -1.0) * 0.5 +
                             12582912.0) & 0x7fffff;
                  auVar65._12_4_ =
                       (uint)((*(float *)((long)local_1c8 + lVar41 + 0x1c) * fVar85 + -1.0) * 0.5 +
                             12582912.0) & 0x7fffff;
                  auVar89._0_4_ = -(uint)((int)((uint)fVar60 & 0x7fffff) < auVar99._0_4_);
                  auVar89._4_4_ = -(uint)((int)((uint)fVar79 & 0x7fffff) < auVar99._4_4_);
                  auVar89._8_4_ = -(uint)((int)auVar65._8_4_ < auVar99._8_4_);
                  auVar89._12_4_ = -(uint)((int)auVar65._12_4_ < auVar99._12_4_);
                  auVar103 = ~auVar89 & auVar99 | auVar65 & auVar89;
                  auVar66._0_4_ = -(uint)(0x400000 < auVar103._0_4_);
                  auVar66._4_4_ = -(uint)(0x400000 < auVar103._4_4_);
                  auVar66._8_4_ = -(uint)(0x400000 < auVar103._8_4_);
                  auVar66._12_4_ = -(uint)(0x400000 < auVar103._12_4_);
                  auVar103 = pshuflw(auVar66 & auVar103,auVar66 & auVar103,0xe8);
                  auVar103 = pshufhw(auVar103,auVar103,0xe8);
                  auVar67._0_8_ =
                       CONCAT26(auVar103._10_2_ * 0x200,
                                CONCAT24(auVar103._8_2_ * 0x40,
                                         CONCAT22(auVar103._2_2_ * 8,auVar103._0_2_)));
                  auVar67._8_8_ = 0;
                  uVar81 = (undefined4)(auVar67._0_8_ >> 0x20);
                  auVar90._4_4_ = uVar81;
                  auVar90._0_4_ = uVar81;
                  auVar90._8_4_ = uVar81;
                  auVar90._12_4_ = uVar81;
                  uVar52 = piVar40[(ushort)(SUB162(auVar90 | auVar67,2) |
                                           SUB162(auVar90 | auVar67,0))];
                  if ((long)(int)uVar52 < 0) {
                    uVar52 = iq3_find_best_neighbour
                                       (local_2e0 + -(long)(int)uVar52,grid,
                                        (float *)((long)local_1c8 + lVar41 + 0x10),
                                        (float *)((long)afStack_138 + lVar41 + 0x80),
                                        (float)local_2c8._0_4_,piVar44);
                    auVar99 = _DAT_0014e9c0;
                    auVar104 = _DAT_0014e740;
                    fVar93 = local_2b8;
                    fVar59 = fStack_2b4;
                    fVar80 = fStack_2b0;
                    fVar85 = fStack_2ac;
                  }
                  uVar4 = grid[uVar52];
                  uVar76 = (undefined1)(uVar4 >> 0x18);
                  uVar73 = (undefined1)(uVar4 >> 0x10);
                  uVar72 = (undefined1)(uVar4 >> 8);
                  auVar68._4_4_ =
                       (int)(CONCAT35(CONCAT21(CONCAT11(uVar76,uVar76),uVar73),
                                      CONCAT14(uVar73,uVar4)) >> 0x20);
                  auVar68[3] = uVar72;
                  auVar68[2] = uVar72;
                  auVar68[0] = (undefined1)uVar4;
                  auVar68[1] = auVar68[0];
                  auVar68._8_8_ = 0;
                  auVar103 = psraw(auVar68,8);
                  uVar57 = auVar103._0_2_ - 1;
                  uVar74 = auVar103._2_2_ - 1;
                  uVar77 = auVar103._4_2_ - 1;
                  uVar82 = auVar103._6_2_ - 1;
                  uVar57 = (uVar57 >> 1) + (uVar57 >> 0xf & uVar57);
                  uVar75 = (uVar74 >> 1) + (uVar74 >> 0xf & uVar74);
                  uVar78 = (uVar77 >> 1) + (uVar77 >> 0xf & uVar77);
                  uVar83 = (uVar82 >> 1) + (uVar82 >> 0xf & uVar82);
                  uVar74 = uVar57 & 0xff;
                  uVar77 = uVar75 & 0xff;
                  uVar82 = uVar78 & 0xff;
                  uVar84 = uVar83 & 0xff;
                  *(uint *)piVar44 =
                       CONCAT13((uVar84 != 0) * (uVar84 < 0x100) * (char)uVar83 - (0xff < uVar84),
                                CONCAT12((uVar82 != 0) * (uVar82 < 0x100) * (char)uVar78 -
                                         (0xff < uVar82),
                                         CONCAT11((uVar77 != 0) * (uVar77 < 0x100) * (char)uVar75 -
                                                  (0xff < uVar77),
                                                  (uVar74 != 0) * (uVar74 < 0x100) * (char)uVar57 -
                                                  (0xff < uVar74))));
                  lVar41 = lVar41 + 0x10;
                  piVar44 = piVar44 + 4;
                } while (lVar41 != 0x80);
                fVar59 = 0.0;
                fVar80 = 0.0;
                lVar41 = 0;
                do {
                  fVar85 = (float)(*(char *)((long)&local_218 + lVar41) * 2 + 1);
                  fVar59 = fVar59 + fVar85 * fVar85 * afStack_138[lVar41];
                  fVar80 = fVar80 + fVar85 * local_1c8[lVar41 + 4] * afStack_138[lVar41];
                  lVar41 = lVar41 + 1;
                } while (lVar41 != 0x20);
                auVar96._0_4_ = ~-(uint)(0.0 < fVar59) & local_2c8._0_4_;
                auVar96._4_4_ = local_2c8._4_4_;
                auVar96._8_4_ = fStack_2c0;
                auVar96._12_4_ = fStack_2bc;
                auVar103 = auVar96 | ZEXT416((uint)(fVar80 / fVar59) & -(uint)(0.0 < fVar59));
              }
              auVar91 = auVar103;
              if (auVar103._0_4_ < 0.0) {
                local_2fc = ~local_2fc;
                auVar91._0_4_ = (uint)auVar103._0_4_ ^ (uint)DAT_0014a080;
                auVar91._4_4_ = 0;
                auVar91._8_4_ = auVar103._8_4_ ^ DAT_0014a080._8_4_;
                auVar91._12_4_ = auVar103._12_4_ ^ DAT_0014a080._12_4_;
              }
              pcVar50 = (char *)&local_218;
              lVar41 = 0;
              do {
                uVar52 = piVar40[((uint)(byte)pcVar50[3] << 9 | (int)pcVar50[2] << 6 |
                                 (int)pcVar50[1] << 3 | (int)*pcVar50) & 0xffff];
                if ((int)uVar52 < 0) {
                  printf("Oops: found point %u not on grid:");
                  lVar41 = 4;
                  do {
                    printf(" %d",(ulong)(uint)(int)*pcVar50);
                    pcVar50 = pcVar50 + 1;
                    lVar41 = lVar41 + -1;
                  } while (lVar41 != 0);
                  putchar(10);
                  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-quants.c"
                             ,0xf59,"fatal error");
                }
                *(char *)((long)puVar48 + lVar41) = (char)uVar52;
                pbVar2 = (byte *)((long)puVar47 + local_2e8 + 0x42);
                *pbVar2 = *pbVar2 | (byte)((uVar52 >> 8) << ((byte)lVar41 & 0x1f));
                lVar41 = lVar41 + 1;
                pcVar50 = pcVar50 + 4;
              } while (lVar41 != 8);
              *local_278 = local_2fc;
              fVar59 = auVar91._0_4_;
              if (fVar59 < 0.0) {
                pcVar50 = "scale >= 0";
                iVar49 = 0xf61;
                goto LAB_00137795;
              }
              puVar48 = puVar48 + 4;
              local_278 = local_278 + 1;
              local_1d8[local_2e8] = fVar59;
              pfVar51 = local_238;
              if (fVar86 <= fVar59) {
                fVar86 = fVar59;
              }
            }
            else {
              local_1d8[local_2e8] = 0.0;
            }
            lVar41 = local_2e8 + 1;
            pfVar45 = pfVar45 + 0x20;
            local_268 = local_268 + 0x20;
          } while (lVar41 != 8);
          if ((fVar86 != 0.0) || (NAN(fVar86))) {
            fVar80 = (fVar86 / 31.0) * 1.033;
            fVar59 = (float)(((uint)fVar80 & 0x7f800000) + 0x7800000);
            if ((uint)((int)fVar80 * 2) < 0x71000000) {
              fVar59 = 2.0;
            }
            fVar59 = fVar59 + ABS(fVar80) * 5.192297e+33 * 7.70372e-34;
            fVar93 = 1.0 / (fVar86 / 31.0);
            fVar86 = (local_1d8[0] * fVar93 + -1.0) * 0.5 + 12582912.0;
            fVar85 = (local_1d8[2] * fVar93 + -1.0) * 0.5 + 12582912.0;
            auVar100._0_8_ = CONCAT44(fVar85,fVar86) & 0x7fffff007fffff;
            auVar100._8_4_ = (uint)((local_1c8[0] * fVar93 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
            auVar100._12_4_ = (uint)((local_1c8[2] * fVar93 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
            auVar97._0_4_ = -(uint)((int)((uint)fVar86 & 0x7fffff) < (int)DAT_0014e7f0);
            auVar97._4_4_ = -(uint)((int)((uint)fVar85 & 0x7fffff) < DAT_0014e7f0._4_4_);
            auVar97._8_4_ = -(uint)((int)auVar100._8_4_ < DAT_0014e7f0._8_4_);
            auVar97._12_4_ = -(uint)((int)auVar100._12_4_ < DAT_0014e7f0._12_4_);
            auVar103 = ~auVar97 & _DAT_0014e7f0 | auVar100 & auVar97;
            auVar101._0_4_ = -(uint)(0x400000 < auVar103._0_4_);
            auVar101._4_4_ = -(uint)(0x400000 < auVar103._4_4_);
            auVar101._8_4_ = -(uint)(0x400000 < auVar103._8_4_);
            auVar101._12_4_ = -(uint)(0x400000 < auVar103._12_4_);
            fVar86 = (local_1d8[1] * fVar93 + -1.0) * 0.5 + 12582912.0;
            fVar85 = (local_1d8[3] * fVar93 + -1.0) * 0.5 + 12582912.0;
            auVar69._0_8_ = CONCAT44(fVar85,fVar86) & 0x7fffff007fffff;
            auVar69._8_4_ = (uint)((local_1c8[1] * fVar93 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
            auVar69._12_4_ = (uint)((local_1c8[3] * fVar93 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
            auVar92._0_4_ = -(uint)((int)((uint)fVar86 & 0x7fffff) < (int)DAT_0014e7f0);
            auVar92._4_4_ = -(uint)((int)((uint)fVar85 & 0x7fffff) < DAT_0014e7f0._4_4_);
            auVar92._8_4_ = -(uint)((int)auVar69._8_4_ < DAT_0014e7f0._8_4_);
            auVar92._12_4_ = -(uint)((int)auVar69._12_4_ < DAT_0014e7f0._12_4_);
            auVar99 = ~auVar92 & _DAT_0014e7f0 | auVar69 & auVar92;
            auVar70._0_4_ = -(uint)(0x400000 < auVar99._0_4_);
            auVar70._4_4_ = -(uint)(0x400000 < auVar99._4_4_);
            auVar70._8_4_ = -(uint)(0x400000 < auVar99._8_4_);
            auVar70._12_4_ = -(uint)(0x400000 < auVar99._12_4_);
            auVar70 = auVar70 & auVar99;
            auVar71._0_4_ = auVar70._0_4_ << 4;
            auVar71._4_4_ = auVar70._4_4_ << 4;
            auVar71._8_4_ = auVar70._8_4_ << 4;
            auVar71._12_4_ = auVar70._12_4_ << 4;
            uVar57 = (SUB42(fVar59,0) & 0xfff) + ((ushort)((uint)fVar59 >> 0xd) & 0x7c00);
            if (0xff000000 < (uint)((int)fVar80 * 2)) {
              uVar57 = 0x7e00;
            }
            *puVar47 = uVar57 | (ushort)((uint)fVar80 >> 0x10) & 0x8000;
            auVar99 = (auVar71 | auVar101 & auVar103) & auVar104;
            sVar9 = auVar99._0_2_;
            cVar5 = (0 < sVar9) * (sVar9 < 0x100) * auVar99[0] - (0xff < sVar9);
            sVar9 = auVar99._2_2_;
            sVar58 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar99[2] - (0xff < sVar9),cVar5);
            sVar9 = auVar99._4_2_;
            cVar6 = (0 < sVar9) * (sVar9 < 0x100) * auVar99[4] - (0xff < sVar9);
            sVar9 = auVar99._6_2_;
            uVar81 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar99[6] - (0xff < sVar9),
                              CONCAT12(cVar6,sVar58));
            sVar9 = auVar99._8_2_;
            cVar7 = (0 < sVar9) * (sVar9 < 0x100) * auVar99[8] - (0xff < sVar9);
            sVar9 = auVar99._10_2_;
            uVar61 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar99[10] - (0xff < sVar9),
                              CONCAT14(cVar7,uVar81));
            sVar9 = auVar99._12_2_;
            cVar8 = (0 < sVar9) * (sVar9 < 0x100) * auVar99[0xc] - (0xff < sVar9);
            sVar10 = auVar99._14_2_;
            sVar9 = (short)((uint)uVar81 >> 0x10);
            sVar56 = (short)((uint6)uVar61 >> 0x20);
            sVar10 = (short)(CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar99[0xe] -
                                      (0xff < sVar10),CONCAT16(cVar8,uVar61)) >> 0x30);
            *(uint *)(puVar47 + 0x35) =
                 CONCAT13((0 < sVar10) * (sVar10 < 0x100) * cVar8 - (0xff < sVar10),
                          CONCAT12((0 < sVar56) * (sVar56 < 0x100) * cVar7 - (0xff < sVar56),
                                   CONCAT11((0 < sVar9) * (sVar9 < 0x100) * cVar6 - (0xff < sVar9),
                                            (0 < sVar58) * (sVar58 < 0x100) * cVar5 -
                                            (0xff < sVar58))));
          }
          uVar43 = local_240 + 1;
          pfVar45 = pfVar51 + 0x100;
          local_288 = local_288 + 0x100;
        } while (uVar43 != local_298);
      }
      local_290 = (void *)((long)local_290 + local_260);
      lVar41 = local_248 + 1;
      local_2a0 = (float *)((long)local_2a0 + local_258);
      nrow = local_250;
    } while (lVar41 != local_250);
  }
  return nrow * local_2a8 * 0x6e;
}

Assistant:

size_t quantize_iq3_s(const float * GGML_RESTRICT src, void * GGML_RESTRICT dst, int64_t nrow, int64_t n_per_row, const float * quant_weights) {
    GGML_ASSERT(n_per_row%QK_K == 0);
    int64_t nblock = n_per_row/QK_K;
    float scales[QK_K/IQ3S_BLOCK_SIZE];
    float weight[IQ3S_BLOCK_SIZE];
    float xval[IQ3S_BLOCK_SIZE];
    int8_t L[IQ3S_BLOCK_SIZE];
    int8_t Laux[IQ3S_BLOCK_SIZE];
    float  waux[IQ3S_BLOCK_SIZE];
    bool   is_on_grid[IQ3S_BLOCK_SIZE/4];
    bool   is_on_grid_aux[IQ3S_BLOCK_SIZE/4];
    uint8_t block_signs[IQ3S_BLOCK_SIZE/8];
    char * qrow = (char *)dst;
    for (int64_t row = 0; row < nrow; ++row) {
        quantize_row_iq3_s_impl(IQ3S_BLOCK_SIZE, src, qrow, n_per_row, quant_weights,
                scales, weight, xval, L, Laux, waux, is_on_grid, is_on_grid_aux, block_signs);
        src += n_per_row;
        qrow += nblock*sizeof(block_iq3_s);
    }
    return nrow * nblock * sizeof(block_iq3_s);
}